

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

void MultiPCM_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  int *piVar1;
  byte bVar2;
  short sVar3;
  undefined4 uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  INT32 IVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  uint uVar16;
  bool bVar17;
  
  lVar5 = *(long *)((long)info + 0x2650);
  if (lVar5 == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  if (samples != 0) {
    uVar9 = 0;
    do {
      iVar14 = 0;
      iVar8 = 0;
      uVar13 = 0;
      pcVar15 = (char *)((long)info + 0x10);
      do {
        bVar17 = true;
        if ((*pcVar15 != '\0') && (pcVar15[0xa9] == '\0')) {
          uVar6 = *(uint *)(pcVar15 + 0x20);
          uVar16 = uVar6 >> 0xc;
          if (pcVar15[0x2c] != '\0') {
            uVar16 = ~uVar16 + *(int *)(pcVar15 + 0xc);
          }
          bVar17 = (pcVar15[0x18] & 4U) == 0;
          if (!bVar17) goto LAB_00163798;
          uVar12 = *(uint *)(pcVar15 + 0x28);
          bVar2 = *(byte *)(lVar5 + (ulong)(*(int *)(pcVar15 + 0x1c) + uVar16 &
                                           *(uint *)((long)info + 0x2648)));
          if (pcVar15[0x88] != '\0') {
            sVar3 = *(short *)(pcVar15 + 0x70);
            *(short *)(pcVar15 + 0x70) = sVar3 + *(short *)(pcVar15 + 0x74);
            uVar12 = uVar12 * *(int *)(*(long *)(pcVar15 + 0x80) +
                                      (long)*(int *)(*(long *)(pcVar15 + 0x78) +
                                                    (ulong)(byte)((ushort)(sVar3 + *(short *)(
                                                  pcVar15 + 0x74)) >> 8) * 4) * 4) >> 8 & 0xfffff;
          }
          uVar12 = uVar12 + uVar6;
          iVar7 = *(int *)(pcVar15 + 0x40);
          *(uint *)(pcVar15 + 0x20) = uVar12;
          if ((uint)(*(int *)(pcVar15 + 0xc) << 0xc) <= uVar12) {
            *(uint *)(pcVar15 + 0x20) =
                 (*(int *)(pcVar15 + 8) - *(int *)(pcVar15 + 0xc)) * 0x1000 + uVar12;
            pcVar15[0x2c] = '\0';
          }
          iVar10 = (int)(short)((ushort)bVar2 << 8);
          if (uVar16 != *(uint *)(pcVar15 + 0x20) >> 0xc) {
            *(int *)(pcVar15 + 0x40) = iVar10;
          }
          uVar16 = *(uint *)(pcVar15 + 0x34) >> 0xc;
          if (uVar16 != *(uint *)(pcVar15 + 0x38)) {
            *(uint *)(pcVar15 + 0x34) = *(uint *)(pcVar15 + 0x34) + *(int *)(pcVar15 + 0x3c);
          }
          iVar7 = (int)((uVar6 & 0xfff) * iVar10 + (0x1000 - (uVar6 & 0xfff)) * iVar7) >> 0xc;
          if (pcVar15[0xa8] != '\0') {
            sVar3 = *(short *)(pcVar15 + 0x90);
            *(short *)(pcVar15 + 0x90) = sVar3 + *(short *)(pcVar15 + 0x94);
            iVar7 = iVar7 * *(int *)(*(long *)(pcVar15 + 0xa0) +
                                    (long)*(int *)(*(long *)(pcVar15 + 0x98) +
                                                  (ulong)(byte)((ushort)(sVar3 + *(short *)(pcVar15 
                                                  + 0x94)) >> 8) * 4) * 4) * 0x10 >> 0xc;
          }
          switch(*(undefined4 *)(pcVar15 + 0x48)) {
          case 0:
            iVar10 = *(int *)(pcVar15 + 0x44);
            *(int *)(pcVar15 + 0x44) = iVar10 + *(int *)(pcVar15 + 0x54);
            if (0x3feffff < iVar10 + *(int *)(pcVar15 + 0x54)) {
              pcVar15[0x44] = '\0';
              pcVar15[0x45] = '\0';
              pcVar15[0x46] = -1;
              pcVar15[0x47] = '\x03';
              pcVar15[0x48] = '\x01';
              pcVar15[0x49] = '\0';
              pcVar15[0x4a] = '\0';
              pcVar15[0x4b] = '\0';
              *(uint *)(pcVar15 + 0x48) = (0x3ffffff < *(int *)(pcVar15 + 0x58)) + 1;
            }
            break;
          case 1:
            uVar6 = *(int *)(pcVar15 + 0x44) - *(int *)(pcVar15 + 0x58);
            if ((int)uVar6 < 1) {
              uVar6 = 0;
            }
            *(uint *)(pcVar15 + 0x44) = uVar6;
            if ((int)(uVar6 >> 0x16) <= *(int *)(pcVar15 + 100)) {
              pcVar15[0x48] = '\x02';
              pcVar15[0x49] = '\0';
              pcVar15[0x4a] = '\0';
              pcVar15[0x4b] = '\0';
            }
            break;
          case 2:
            iVar10 = *(int *)(pcVar15 + 0x44) - *(int *)(pcVar15 + 0x5c);
            if (iVar10 < 1) {
              iVar10 = 0;
            }
            *(int *)(pcVar15 + 0x44) = iVar10;
            break;
          case 3:
            piVar1 = (int *)(pcVar15 + 0x44);
            iVar10 = *piVar1;
            *piVar1 = *piVar1 - *(int *)(pcVar15 + 0x60);
            if (*piVar1 == 0 || SBORROW4(iVar10,*(int *)(pcVar15 + 0x60)) != *piVar1 < 0) {
              pcVar15[0x44] = '\0';
              pcVar15[0x45] = '\0';
              pcVar15[0x46] = '\0';
              pcVar15[0x47] = '\0';
              *pcVar15 = '\0';
            }
            break;
          default:
            IVar11 = 0x1000;
            goto LAB_00163761;
          }
          if (((pcVar15[0x4c] != '\0') && (*(int *)(pcVar15 + 0x48) != 0)) &&
             (*(int *)(pcVar15 + 0x44) < 0x3010000)) {
            uVar4 = *(undefined4 *)((long)info + 0x1584);
            *(undefined4 *)(pcVar15 + 0x58) = uVar4;
            *(undefined4 *)(pcVar15 + 0x5c) = uVar4;
            *(undefined4 *)(pcVar15 + 0x60) = uVar4;
          }
          IVar11 = linear_to_exp_volume[*(short *)(pcVar15 + 0x46)];
LAB_00163761:
          uVar16 = *(int *)(pcVar15 + 0x30) << 7 | uVar16;
          iVar7 = IVar11 * iVar7 >> 10;
          iVar14 = iVar14 + (left_pan_table[uVar16] * iVar7 >> 0xc);
          iVar8 = iVar8 + (iVar7 * right_pan_table[uVar16] >> 0xc);
        }
LAB_00163798:
        if (!bVar17) break;
        pcVar15 = pcVar15 + 0xb8;
        bVar17 = uVar13 < 0x1b;
        uVar13 = uVar13 + 1;
      } while (bVar17);
      (*outputs)[uVar9] = iVar14;
      outputs[1][uVar9] = iVar8;
      uVar9 = uVar9 + 1;
    } while (uVar9 != samples);
  }
  return;
}

Assistant:

static void MultiPCM_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	UINT32 i, sl;

	if (ptChip->ROM == NULL)
	{
		memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
		memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; ++i)
	{
		DEV_SMPL smpl = 0;
		DEV_SMPL smpr = 0;
		for (sl = 0; sl < 28; ++sl)
		{
			slot_t *slot = &ptChip->slots[sl];
			if (slot->playing && ! slot->muted)
			{
				UINT32 vol = (slot->total_level >> TL_SHIFT) | (slot->pan << 7);
				UINT32 spos = slot->offset >> TL_SHIFT;
				UINT32 step = slot->step;
				INT32 csample;
				INT32 fpart = slot->offset & ((1 << TL_SHIFT) - 1);
				INT32 sample;

				if (slot->reverse)
				{
					spos = slot->sample.end - spos - 1;
				}

				if (slot->sample.format & 4)	// 12-bit linear
				{
					UINT32 adr = slot->base + (spos >> 1) * 3;
					if (!(spos & 1))
					{ // ab.c ..
						INT16 w0 = (read_byte(ptChip, adr) << 8) | ((read_byte(ptChip, adr + 1) & 0xf) << 4);
						csample = w0;
						break;
					}
					else
					{ // ..C. AB
						INT16 w0 = (read_byte(ptChip, adr + 2) << 8) | (read_byte(ptChip, adr + 1) & 0xf0);
						csample = w0;
						break;
					}
				}
				else
				{
					csample = (INT16)(read_byte(ptChip, slot->base + spos) << 8);
				}

				sample = (csample * fpart + slot->prev_sample * ((1 << TL_SHIFT) - fpart)) >> TL_SHIFT;

				if (slot->vibrato) // Vibrato enabled
				{
					step = step * pitch_lfo_step(&slot->pitch_lfo);
					step >>= TL_SHIFT;
				}

				slot->offset += step;
				if (slot->offset >= (slot->sample.end << TL_SHIFT))
				{
					slot->offset -= (slot->sample.end - slot->sample.loop) << TL_SHIFT;
					// DD-9 expects the looped silence at the end of some samples to be the same whether reversed or not
					slot->reverse = false;
				}

				if (spos ^ (slot->offset >> TL_SHIFT))
				{
					slot->prev_sample = csample;
				}

				if ((slot->total_level >> TL_SHIFT) != slot->dest_total_level)
				{
					slot->total_level += slot->total_level_step;
				}

				if (slot->tremolo) // Tremolo enabled
				{
					sample = sample * amplitude_lfo_step(&slot->amplitude_lfo);
					sample >>= TL_SHIFT;
				}

				sample = (sample * envelope_generator_update(ptChip, slot)) >> 10;

				smpl += (left_pan_table[vol] * sample) >> TL_SHIFT;
				smpr += (right_pan_table[vol] * sample) >> TL_SHIFT;
			}
		}

		outputs[0][i] = smpl;
		outputs[1][i] = smpr;
	}
}